

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O2

void __thiscall
QOpenGLShaderProgram::setUniformValue(QOpenGLShaderProgram *this,int location,QColor *color)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (location != -1) {
    lVar1 = *(long *)&this->field_0x8;
    local_38 = QColor::redF();
    local_34 = QColor::greenF();
    local_30 = QColor::blueF();
    local_2c = QColor::alphaF();
    (**(code **)(**(long **)(lVar1 + 0xd0) + 1000))(location,1,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLShaderProgram::setUniformValue(int location, const QColor& color)
{
    Q_D(QOpenGLShaderProgram);
    Q_UNUSED(d);
    if (location != -1) {
        GLfloat values[4] = {GLfloat(color.redF()), GLfloat(color.greenF()),
                             GLfloat(color.blueF()), GLfloat(color.alphaF())};
        d->glfuncs->glUniform4fv(location, 1, values);
    }
}